

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall WrappedArgsParser::print_help(WrappedArgsParser *this)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  doc_string local_580;
  doc_formatting local_560;
  doc_formatting clipp_fmt;
  
  memset(&local_560,0,0x2a8);
  clipp::doc_formatting::doc_formatting(&local_560);
  local_560.firstCol_ = 4;
  if (local_560.lastCol_ < 4) {
    local_560.firstCol_ = local_560.lastCol_;
  }
  local_560.docCol_ = 0x1c;
  if (local_560.lastCol_ < 0x1c) {
    local_560.docCol_ = local_560.lastCol_;
  }
  local_560.lastCol_ = 0x50;
  clipp::doc_formatting::doc_formatting(&clipp_fmt,&local_560);
  clipp::doc_formatting::~doc_formatting(&local_560);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)this);
  poVar1 = std::operator<<(poVar1,
                           " - history manager command line wrapper, which eases access to hm-db application"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_580,(string *)this);
  clipp::make_man_page((man_page *)&local_560,&this->wrapper_cli,&local_580,&clipp_fmt);
  pbVar2 = clipp::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                             (man_page *)&local_560);
  std::endl<char,std::char_traits<char>>(pbVar2);
  clipp::man_page::~man_page((man_page *)&local_560);
  std::__cxx11::string::~string((string *)&local_580);
  clipp::doc_formatting::~doc_formatting(&clipp_fmt);
  return;
}

Assistant:

void print_help() const {
    const auto clipp_fmt =
        doc_formatting{}.first_column(4).doc_column(28).last_column(80);

    std::cout << program_name
              << " - history manager command line wrapper, which eases access "
                 "to hm-db application"
              << std::endl
              << std::endl;
    std::cout << make_man_page(wrapper_cli, program_name, clipp_fmt)
              << std::endl;
  }